

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void RtMidi::getCompiledApi(vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *apis)

{
  allocator<RtMidi::Api> local_29;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> local_28;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *local_10;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *apis_local;
  
  local_10 = apis;
  std::allocator<RtMidi::Api>::allocator(&local_29);
  std::vector<RtMidi::Api,std::allocator<RtMidi::Api>>::vector<RtMidi::Api_const*,void>
            ((vector<RtMidi::Api,std::allocator<RtMidi::Api>> *)&local_28,rtmidi_compiled_apis,
             rtmidi_compiled_apis + 1,&local_29);
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator=(local_10,&local_28);
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::~vector(&local_28);
  std::allocator<RtMidi::Api>::~allocator(&local_29);
  return;
}

Assistant:

void RtMidi :: getCompiledApi( std::vector<RtMidi::Api> &apis ) throw()
{
  apis = std::vector<RtMidi::Api>(rtmidi_compiled_apis,
                                  rtmidi_compiled_apis + rtmidi_num_compiled_apis);
}